

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O0

data_type * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::text_grid::data_type>::allocate_array
          (memory_manager_stateless_kernel_1<dlib::text_grid::data_type> *this,unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  data_type *pdVar4;
  ulong in_RSI;
  ulong uVar5;
  data_type *local_40;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x58),0);
  uVar5 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = in_RSI;
  pdVar4 = (data_type *)(puVar3 + 1);
  if (in_RSI != 0) {
    local_40 = pdVar4;
    do {
      text_grid::data_type::data_type(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != pdVar4 + in_RSI);
  }
  return pdVar4;
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }